

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream_test.c
# Opt level: O2

int main(void)

{
  uint64_t uVar1;
  long lVar2;
  uint i;
  uint num_bits;
  ulong uVar3;
  uint64_t value;
  int iVar4;
  ulong uVar5;
  bool bVar6;
  uint8_t buffer [8];
  int local_74;
  uint8_t buffer2 [8];
  uint8_t buffer_1 [8];
  bitstream_t bsr;
  bitstream_t bsw;
  anon_union_8_2_94730226_for_buffer local_40;
  undefined8 local_38;
  
  num_bits = 1;
  lVar2 = 0x40;
  local_74 = 0;
  while (bVar6 = lVar2 != 0, lVar2 = lVar2 + -1, bVar6) {
    buffer[0] = '\0';
    buffer[1] = '\0';
    buffer[2] = '\0';
    buffer[3] = '\0';
    buffer[4] = '\0';
    buffer[5] = '\0';
    buffer[6] = '\0';
    buffer[7] = '\0';
    bsw.position = 0;
    value = 1L << ((ulong)(num_bits - 1) & 0x3f);
    bsw.buffer.w = buffer;
    bitstream_put_bits(&bsw,value,num_bits);
    bsr.position = 0;
    bsr.buffer.w = buffer;
    uVar1 = bitstream_get_bits(&bsr,num_bits);
    if (uVar1 != value) {
      printf("simple_test: expected %016lx, got %016lx\n",value,uVar1);
      local_74 = -1;
    }
    if (buffer[0] != 0x80) {
      printf("simple_test: expected buffer 80000000000000000000, got %02x%02x%02x%02x%02x%02x%02x%02x\n"
             ,(ulong)buffer & 0xff,(ulong)buffer >> 8 & 0xff,(ulong)buffer >> 0x10 & 0xff,
             (ulong)buffer >> 0x18 & 0xff,(ulong)buffer >> 0x20 & 0xff,(ulong)buffer >> 0x28 & 0xff,
             (ulong)buffer >> 0x30 & 0xff,(ulong)buffer >> 0x38);
      local_74 = -1;
    }
    num_bits = num_bits + 1;
  }
  if (local_74 != 0) {
    puts("simple_test: failed!");
  }
  buffer_1[0] = '\0';
  buffer_1[1] = '\0';
  buffer_1[2] = '\0';
  buffer_1[3] = '\0';
  buffer_1[4] = '\0';
  buffer_1[5] = '\0';
  buffer_1[6] = '\0';
  buffer_1[7] = '\0';
  buffer2[0] = '\0';
  buffer2[1] = '\0';
  buffer2[2] = '\0';
  buffer2[3] = '\0';
  buffer2[4] = '\0';
  buffer2[5] = '\0';
  buffer2[6] = '\0';
  buffer2[7] = '\0';
  bsw.position = 0;
  bsw.buffer.w = buffer_1;
  bitstream_put_bits(&bsw,0x361b294a,0x1e);
  bsr.position = 0;
  bsr.buffer.w = buffer2;
  for (uVar5 = 0x1d; uVar5 != 0xffffffffffffffff; uVar5 = uVar5 - 1) {
    bitstream_put_bits(&bsr,0x361b294aL >> (uVar5 & 0x3f),1);
  }
  buffer = (uint8_t  [8])buffer_1;
  uVar1 = bitstream_get_bits((bitstream_t *)buffer,0x1e);
  iVar4 = 0;
  if (uVar1 != 0x361b294a) {
    printf("test_30: expected %016lx, got %016lx\n",0x361b294a,uVar1);
    iVar4 = -1;
  }
  local_38 = 0;
  local_40.w = buffer2;
  for (uVar5 = 0x1d; uVar5 != 0xffffffffffffffff; uVar5 = uVar5 - 1) {
    uVar1 = bitstream_get_bits((bitstream_t *)&local_40,1);
    uVar3 = (ulong)((uint)(0x361b294aL >> (uVar5 & 0x3f)) & 1);
    if (uVar3 != uVar1) {
      printf("test_30: expected2 %016lx, got %016lx\n",uVar3,uVar1);
      iVar4 = -1;
    }
  }
  if (buffer_1[3] != '(' || (buffer_1[2] != 0xa5 || (buffer_1[1] != 'l' || buffer_1[0] != 0xd8))) {
    printf("test_30: expected buffer %016lx, got %02x%02x%02x%02x%02x%02x%02x%02x\n",
           0xd86ca52800000000,(ulong)buffer_1 & 0xff,(ulong)buffer_1[1],(ulong)buffer_1[2],
           (ulong)buffer_1[3],(ulong)buffer_1 >> 0x20 & 0xff,(ulong)buffer_1 >> 0x28 & 0xff,
           (ulong)buffer_1 >> 0x30 & 0xff,(ulong)buffer_1 >> 0x38);
    iVar4 = -1;
  }
  if (buffer2[3] == '(' && (buffer2[2] == 0xa5 && (buffer2[1] == 'l' && buffer2[0] == 0xd8))) {
    if (iVar4 == 0) goto LAB_0010144a;
  }
  else {
    printf("test_30: expected buffer2 %016lx, got %02x%02x%02x%02x%02x%02x%02x%02x\n",
           0xd86ca52800000000,(ulong)buffer2 & 0xff,(ulong)buffer2[1],(ulong)buffer2[2],
           (ulong)buffer2[3],(ulong)buffer2 >> 0x20 & 0xff,(ulong)buffer2 >> 0x28 & 0xff,
           (ulong)buffer2 >> 0x30 & 0xff,(ulong)buffer2 >> 0x38);
    iVar4 = -1;
  }
  puts("test_30: failed!");
  local_74 = iVar4;
LAB_0010144a:
  buffer[0] = '\0';
  buffer[1] = '\0';
  buffer[2] = '\0';
  buffer[3] = '\0';
  buffer[4] = '\0';
  buffer[5] = '\0';
  buffer[6] = '\0';
  buffer[7] = '\0';
  bsw.position = 0;
  bsw.buffer.w = buffer;
  bitstream_put_bits(&bsw,0x361b294a,0x1e);
  bitstream_put_bits(&bsw,0x9e4d6b5,0x1e);
  bsr.position = 0;
  bsr.buffer.w = buffer;
  uVar1 = bitstream_get_bits(&bsr,0x1e);
  iVar4 = 0;
  if (uVar1 != 0x361b294a) {
    printf("test_multiple_30: expected %016lx, got %016lx\n",0x361b294a,uVar1);
    iVar4 = -1;
  }
  uVar1 = bitstream_get_bits(&bsr,0x1e);
  if (uVar1 != 0x9e4d6b5) {
    printf("test_multiple_30: expected %016lx, got %016lx\n",0x9e4d6b5,uVar1);
    iVar4 = -1;
  }
  if (buffer[3] == '(' && (buffer[2] == 0xa5 && (buffer[1] == 'l' && buffer[0] == 0xd8))) {
    if (iVar4 == 0) {
      return local_74;
    }
  }
  else {
    printf("test_30: expected buffer %016lx, got %02x%02x%02x%02x%02x%02x%02x%02x\n",
           0xd86ca52800000000,(ulong)buffer & 0xff,(ulong)buffer[1],(ulong)buffer[2],
           (ulong)buffer[3],(ulong)buffer >> 0x20 & 0xff,(ulong)buffer >> 0x28 & 0xff,
           (ulong)buffer >> 0x30 & 0xff,(ulong)buffer >> 0x38);
  }
  puts("test_multiple_30: failed!");
  return -1;
}

Assistant:

int main(void) {
  int ret = 0;

  int tmp = simple_test();
  if (tmp) {
    printf("simple_test: failed!\n");
    ret = tmp;
  }

  tmp = test_30();
  if (tmp) {
    printf("test_30: failed!\n");
    ret = tmp;
  }

  tmp = test_multiple_30();
  if (tmp) {
    printf("test_multiple_30: failed!\n");
    ret = tmp;
  }

  return ret;
}